

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_lock.cpp
# Opt level: O2

void __thiscall duckdb::StorageLockKey::~StorageLockKey(StorageLockKey *this)

{
  StorageLockInternals *pSVar1;
  
  if (this->type == EXCLUSIVE) {
    pSVar1 = shared_ptr<duckdb::StorageLockInternals,_true>::operator->(&this->internals);
    pthread_mutex_unlock((pthread_mutex_t *)&pSVar1->exclusive_lock);
  }
  else {
    pSVar1 = shared_ptr<duckdb::StorageLockInternals,_true>::operator->(&this->internals);
    LOCK();
    (pSVar1->read_count).super___atomic_base<unsigned_long>._M_i =
         (pSVar1->read_count).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->internals).internal.
              super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

StorageLockKey::~StorageLockKey() {
	if (type == StorageLockType::EXCLUSIVE) {
		internals->ReleaseExclusiveLock();
	} else {
		D_ASSERT(type == StorageLockType::SHARED);
		internals->ReleaseSharedLock();
	}
}